

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

ArrayElement * __thiscall
soul::Optimisations::Inliner::cloneArrayElement(Inliner *this,ArrayElement *old)

{
  Module *this_00;
  Expression *pEVar1;
  pool_ptr<soul::heart::Expression> local_30;
  pool_ptr<soul::heart::Expression> local_28;
  Function *local_20;
  ArrayElement *s;
  ArrayElement *old_local;
  Inliner *this_local;
  
  this_00 = this->module;
  s = old;
  old_local = (ArrayElement *)this;
  pEVar1 = pool_ref::operator_cast_to_Expression_((pool_ref *)&old->parent);
  pEVar1 = cloneExpression(this,pEVar1);
  local_20 = (Function *)
             Module::
             allocate<soul::heart::ArrayElement,soul::CodeLocation_const&,soul::heart::Expression&,unsigned_long_const&,unsigned_long_const&>
                       (this_00,&(old->super_Expression).super_Object.location,pEVar1,
                        &s->fixedStartIndex,&s->fixedEndIndex);
  local_30.object = (s->dynamicIndex).object;
  cloneExpressionPtr((Inliner *)&stack0xffffffffffffffd8,(pool_ptr<soul::heart::Expression> *)this);
  ((pool_ptr<soul::heart::Expression> *)&(local_20->returnType).boundingSize)->object =
       local_28.object;
  pool_ptr<soul::heart::Expression>::~pool_ptr(&stack0xffffffffffffffd8);
  pool_ptr<soul::heart::Expression>::~pool_ptr(&local_30);
  *(byte *)((long)&(local_20->parameters).items + 1) = s->suppressWrapWarning & 1;
  *(byte *)&(local_20->parameters).items = s->isRangeTrusted & 1;
  return (ArrayElement *)local_20;
}

Assistant:

heart::ArrayElement& cloneArrayElement (const heart::ArrayElement& old)
        {
            auto& s = module.allocate<heart::ArrayElement> (old.location,
                                                            cloneExpression (old.parent),
                                                            old.fixedStartIndex,
                                                            old.fixedEndIndex);

            s.dynamicIndex = cloneExpressionPtr (old.dynamicIndex);
            s.suppressWrapWarning = old.suppressWrapWarning;
            s.isRangeTrusted = old.isRangeTrusted;
            return s;
        }